

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

void __thiscall QDir::setNameFilters(QDir *this,QStringList *nameFilters)

{
  QDirPrivate *this_00;
  
  this_00 = (this->d_ptr).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QSharedDataPointer<QDirPrivate>::detach_helper(&this->d_ptr);
    this_00 = (this->d_ptr).d.ptr;
  }
  QDirPrivate::clearCache(this_00,KeepMetaData);
  QArrayDataPointer<QString>::operator=(&(this_00->nameFilters).d,&nameFilters->d);
  return;
}

Assistant:

void QDir::setNameFilters(const QStringList &nameFilters)
{
    Q_D(QDir);
    d->clearCache(QDirPrivate::KeepMetaData);
    d->nameFilters = nameFilters;
}